

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpointer.c
# Opt level: O3

void xmlXPtrStartPointFunction(xmlXPathParserContextPtr ctxt,int nargs)

{
  xmlXPathObjectType xVar1;
  int *piVar2;
  int *piVar3;
  xmlXPathObjectPtr pxVar4;
  xmlXPathObjectPtr pxVar5;
  xmlLocationSetPtr obj;
  long lVar6;
  int error;
  xmlNodePtr node;
  
  if (ctxt == (xmlXPathParserContextPtr)0x0) {
    return;
  }
  if (nargs != 1) {
    error = 0xc;
    goto LAB_001ebb0c;
  }
  if (ctxt->valueNr <= ctxt->valueFrame) {
    error = 0x17;
    goto LAB_001ebb0c;
  }
  if ((ctxt->value == (xmlXPathObjectPtr)0x0) ||
     ((xVar1 = ctxt->value->type, xVar1 != XPATH_NODESET && (xVar1 != XPATH_LOCATIONSET)))) {
    error = 0xb;
    goto LAB_001ebb0c;
  }
  pxVar4 = valuePop(ctxt);
  pxVar5 = pxVar4;
  if (pxVar4->type == XPATH_NODESET) {
    pxVar5 = xmlXPtrNewLocationSetNodeSet(pxVar4->nodesetval);
    xmlXPathFreeObject(pxVar4);
    if (pxVar5 != (xmlXPathObjectPtr)0x0) goto LAB_001eb9ec;
  }
  else {
LAB_001eb9ec:
    obj = (xmlLocationSetPtr)(*xmlMalloc)(0x10);
    if (obj != (xmlLocationSetPtr)0x0) {
      obj->locNr = 0;
      obj->locMax = 0;
      obj->locTab = (xmlXPathObjectPtr *)0x0;
      piVar2 = (int *)pxVar5->user;
      if ((piVar2 != (int *)0x0) && (0 < *piVar2)) {
        lVar6 = 0;
        do {
          piVar3 = *(int **)(*(long *)(piVar2 + 2) + lVar6 * 8);
          if (piVar3 != (int *)0x0) {
            if (*piVar3 == 6) {
              node = *(xmlNodePtr *)(piVar3 + 10);
              if (node != (xmlNodePtr)0x0) {
                if ((node->type | XML_ATTRIBUTE_DECL) != XML_NAMESPACE_DECL) goto LAB_001eba57;
                xmlXPathFreeObject(pxVar5);
                xmlXPtrFreeLocationSet(obj);
                error = 0x10;
                goto LAB_001ebb0c;
              }
            }
            else if (*piVar3 == 5) {
              node = *(xmlNodePtr *)(piVar3 + 10);
LAB_001eba57:
              pxVar4 = xmlXPtrNewPoint(node,piVar3[0xc]);
              if (pxVar4 != (xmlXPathObjectPtr)0x0) {
                xmlXPtrLocationSetAdd(obj,pxVar4);
              }
            }
          }
          lVar6 = lVar6 + 1;
        } while (lVar6 < *piVar2);
      }
      xmlXPathFreeObject(pxVar5);
      pxVar5 = (xmlXPathObjectPtr)(*xmlMalloc)(0x48);
      if (pxVar5 == (xmlXPathObjectPtr)0x0) {
        xmlXPtrErrMemory("allocating locationset");
      }
      else {
        *(undefined8 *)pxVar5 = 0;
        pxVar5->nodesetval = (xmlNodeSetPtr)0x0;
        pxVar5->stringval = (xmlChar *)0x0;
        pxVar5->user = (void *)0x0;
        *(undefined8 *)&pxVar5->index = 0;
        pxVar5->user2 = (void *)0x0;
        *(undefined8 *)&pxVar5->boolval = 0;
        pxVar5->floatval = 0.0;
        *(undefined8 *)&pxVar5->index2 = 0;
        pxVar5->type = XPATH_LOCATIONSET;
        pxVar5->user = obj;
      }
      valuePush(ctxt,pxVar5);
      return;
    }
    xmlXPtrErrMemory("allocating locationset");
    xmlXPathFreeObject(pxVar5);
  }
  error = 0xf;
LAB_001ebb0c:
  xmlXPathErr(ctxt,error);
  return;
}

Assistant:

static void
xmlXPtrStartPointFunction(xmlXPathParserContextPtr ctxt, int nargs) {
    xmlXPathObjectPtr tmp, obj, point;
    xmlLocationSetPtr newset = NULL;
    xmlLocationSetPtr oldset = NULL;

    CHECK_ARITY(1);
    if ((ctxt->value == NULL) ||
	((ctxt->value->type != XPATH_LOCATIONSET) &&
	 (ctxt->value->type != XPATH_NODESET)))
        XP_ERROR(XPATH_INVALID_TYPE)

    obj = valuePop(ctxt);
    if (obj->type == XPATH_NODESET) {
	/*
	 * First convert to a location set
	 */
	tmp = xmlXPtrNewLocationSetNodeSet(obj->nodesetval);
	xmlXPathFreeObject(obj);
	if (tmp == NULL)
            XP_ERROR(XPATH_MEMORY_ERROR)
	obj = tmp;
    }

    newset = xmlXPtrLocationSetCreate(NULL);
    if (newset == NULL) {
	xmlXPathFreeObject(obj);
        XP_ERROR(XPATH_MEMORY_ERROR);
    }
    oldset = (xmlLocationSetPtr) obj->user;
    if (oldset != NULL) {
	int i;

	for (i = 0; i < oldset->locNr; i++) {
	    tmp = oldset->locTab[i];
	    if (tmp == NULL)
		continue;
	    point = NULL;
	    switch (tmp->type) {
		case XPATH_POINT:
		    point = xmlXPtrNewPoint(tmp->user, tmp->index);
		    break;
		case XPATH_RANGE: {
		    xmlNodePtr node = tmp->user;
		    if (node != NULL) {
			if ((node->type == XML_ATTRIBUTE_NODE) ||
                            (node->type == XML_NAMESPACE_DECL)) {
			    xmlXPathFreeObject(obj);
			    xmlXPtrFreeLocationSet(newset);
			    XP_ERROR(XPTR_SYNTAX_ERROR);
			}
			point = xmlXPtrNewPoint(node, tmp->index);
		    }
		    break;
	        }
		default:
		    /*** Should we raise an error ?
		    xmlXPathFreeObject(obj);
		    xmlXPathFreeObject(newset);
		    XP_ERROR(XPATH_INVALID_TYPE)
		    ***/
		    break;
	    }
            if (point != NULL)
		xmlXPtrLocationSetAdd(newset, point);
	}
    }
    xmlXPathFreeObject(obj);
    valuePush(ctxt, xmlXPtrWrapLocationSet(newset));
}